

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  TargetType TVar1;
  char *pcVar2;
  pointer ppcVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer ppcVar6;
  cmGlobalGenerator *this_00;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  string fname;
  cmGeneratedFileStream fout;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_2d0;
  string local_2b8;
  long *local_298 [2];
  long local_288 [2];
  cmGeneratedFileStream local_278;
  
  pcVar2 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_298,pcVar2,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_298);
  std::__cxx11::string::append((char *)local_298);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_298[0],false,None);
  ppcVar3 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    uVar5 = 0;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_2d0,&ppcVar3[uVar5]->GeneratorTargets);
      ppcVar6 = local_2d0.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_2d0.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_2d0.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          this_00 = (cmGlobalGenerator *)*ppcVar6;
          TVar1 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
          if (TVar1 != INTERFACE_LIBRARY) {
            WriteSummary(this_00,*ppcVar6);
            cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_2b8,*ppcVar6);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_278,local_2b8._M_dataplus._M_p,
                                local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ppcVar6 = ppcVar6 + 1;
        } while (ppcVar6 !=
                 local_2d0.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_2d0.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      ppcVar3 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3))
    ;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = this->CMakeInstance->GetHomeOutputDirectory();
  fname += cmake::GetCMakeFilesDirectory();
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname.c_str());

  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmGeneratorTarget*> tgts =
      this->LocalGenerators[i]->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator it = tgts.begin();
         it != tgts.end(); ++it) {
      if ((*it)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->WriteSummary(*it);
      fout << (*it)->GetSupportDirectory() << "\n";
    }
  }
}